

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::int16ScalarVectorCheck
          (TParseVersions *this,TSourceLoc *loc,char *op,bool builtIn)

{
  char *local_48;
  char *extensions [4];
  bool builtIn_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  if (!builtIn) {
    local_48 = "GL_AMD_gpu_shader_int16";
    extensions[0] = "GL_EXT_shader_16bit_storage";
    extensions[1] = "GL_EXT_shader_explicit_arithmetic_types";
    extensions[2] = "GL_EXT_shader_explicit_arithmetic_types_int16";
    extensions[3]._7_1_ = builtIn;
    (*this->_vptr_TParseVersions[5])(this,loc,4,&local_48,op);
  }
  return;
}

Assistant:

void TParseVersions::int16ScalarVectorCheck(const TSourceLoc& loc, const char* op, bool builtIn)
{
    if (! builtIn) {
    	const char* const extensions[] = {
                                           E_GL_AMD_gpu_shader_int16,
                                           E_GL_EXT_shader_16bit_storage,
                                           E_GL_EXT_shader_explicit_arithmetic_types,
                                           E_GL_EXT_shader_explicit_arithmetic_types_int16};
        requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, op);
    }
}